

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Ray * __thiscall pbrt::AnimatedTransform::ApplyInverse(AnimatedTransform *this,Ray *r,Float *tMax)

{
  long in_RDX;
  long in_RSI;
  Ray *in_RDI;
  Transform t;
  Float in_stack_0000028c;
  AnimatedTransform *in_stack_00000290;
  
  if (((*(byte *)(in_RSI + 0x108) & 1) == 0) ||
     (*(float *)(in_RDX + 0x18) <= *(float *)(in_RSI + 0x100))) {
    Transform::ApplyInverse
              ((Transform *)t.m.m[3]._0_8_,(Ray *)t.m.m[2]._8_8_,(Float *)t.m.m[2]._0_8_);
  }
  else if (*(float *)(in_RDX + 0x18) < *(float *)(in_RSI + 0x104)) {
    Interpolate(in_stack_00000290,in_stack_0000028c);
    Transform::ApplyInverse
              ((Transform *)t.m.m[3]._0_8_,(Ray *)t.m.m[2]._8_8_,(Float *)t.m.m[2]._0_8_);
  }
  else {
    Transform::ApplyInverse
              ((Transform *)t.m.m[3]._0_8_,(Ray *)t.m.m[2]._8_8_,(Float *)t.m.m[2]._0_8_);
  }
  return in_RDI;
}

Assistant:

Ray AnimatedTransform::ApplyInverse(const Ray &r, Float *tMax) const {
    if (!actuallyAnimated || r.time <= startTime)
        return startTransform.ApplyInverse(r, tMax);
    else if (r.time >= endTime)
        return endTransform.ApplyInverse(r, tMax);
    else {
        Transform t = Interpolate(r.time);
        return t.ApplyInverse(r, tMax);
    }
}